

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O2

bool __thiscall cmCTestSVN::LoadModifications(cmCTestSVN *this)

{
  vector<const_char_*,_std::allocator<const_char_*>_> svn_status;
  OutputLogger err;
  StatusParser out;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_178;
  LineParser local_160;
  StatusParser local_120;
  
  local_178._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_120.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x450b16;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_178,(char **)&local_120);
  StatusParser::StatusParser(&local_120,this,"status-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)&local_160,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "status-err> ");
  RunSVNCommand(this,(vector<const_char_*,_std::allocator<const_char_*>_> *)&local_178,
                (OutputParser *)&local_120,&local_160.super_OutputParser);
  cmProcessTools::LineParser::~LineParser(&local_160);
  StatusParser::~StatusParser(&local_120);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_178);
  return true;
}

Assistant:

bool cmCTestSVN::LoadModifications()
{
  // Run "svn status" which reports local modifications.
  std::vector<const char*> svn_status;
  svn_status.push_back("status");
  StatusParser out(this, "status-out> ");
  OutputLogger err(this->Log, "status-err> ");
  this->RunSVNCommand(svn_status, &out, &err);
  return true;
}